

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS_util.cpp
# Opt level: O0

Vector<double,_std::allocator<double>_> *
amrex::VectorMin(Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *mfs,
                IntVect *param_2,int sComp,int nComp,int nGrow)

{
  double *pdVar1;
  long lVar2;
  Long LVar3;
  Vector<double,_std::allocator<double>_> *in_RDI;
  int in_R8D;
  Real RVar4;
  int n_1;
  int i;
  int n;
  Vector<double,_std::allocator<double>_> *gMin;
  undefined1 in_stack_00000257;
  int in_stack_00000258;
  int in_stack_0000025c;
  MultiFab *in_stack_00000260;
  size_type in_stack_ffffffffffffff58;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
  *in_stack_ffffffffffffff60;
  Real local_48;
  int local_40;
  int local_3c;
  int local_38;
  undefined1 local_25;
  int local_20;
  
  local_25 = 0;
  local_20 = in_R8D;
  std::allocator<double>::allocator((allocator<double> *)0x87a0ba);
  Vector<double,_std::allocator<double>_>::vector
            ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58,(allocator_type *)0x87a0ce);
  std::allocator<double>::~allocator((allocator<double> *)0x87a0dd);
  for (local_38 = 0; local_38 < local_20; local_38 = local_38 + 1) {
    Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::operator[]
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    RVar4 = MultiFab::min(in_stack_00000260,in_stack_0000025c,in_stack_00000258,
                          (bool)in_stack_00000257);
    pdVar1 = Vector<double,_std::allocator<double>_>::operator[]
                       ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff60,
                        in_stack_ffffffffffffff58);
    *pdVar1 = RVar4;
  }
  for (local_3c = 1; lVar2 = (long)local_3c,
      LVar3 = Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::size
                        ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                          *)0x87a1b5), lVar2 < LVar3; local_3c = local_3c + 1) {
    for (local_40 = 0; local_40 < local_20; local_40 = local_40 + 1) {
      pdVar1 = Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff60,
                          in_stack_ffffffffffffff58);
      Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::operator[]
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      local_48 = MultiFab::min(in_stack_00000260,in_stack_0000025c,in_stack_00000258,
                               (bool)in_stack_00000257);
      pdVar1 = std::min<double>(pdVar1,&local_48);
      in_stack_ffffffffffffff60 =
           (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)*pdVar1;
      pdVar1 = Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff60,
                          in_stack_ffffffffffffff58);
      *pdVar1 = (double)in_stack_ffffffffffffff60;
    }
  }
  return in_RDI;
}

Assistant:

Vector<Real>
  VectorMin(const Vector<const MultiFab *>& mfs,
            const IntVect&                  /*tilesize*/,
            int                             sComp,
            int                             nComp,
            int                             nGrow)
  {
    Vector<Real> gMin(nComp);

    for (int n=0; n<nComp; ++n) {
      gMin[n] = mfs[0]->min(sComp+n,nGrow);
    }

    for (int i=1; i<mfs.size(); ++i) {

      for (int n=0; n<nComp; ++n) {
        gMin[n] = std::min(gMin[n], mfs[i]->min(sComp+n,nGrow));
      }
    }

    return gMin;
  }